

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::define_data(PeleLM *this)

{
  Vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  *this_00;
  MultiFab *pMVar1;
  PeleLM *pPVar2;
  bool bVar3;
  int nvar;
  StateDescriptor *this_01;
  __uniq_ptr_data<FluxBoxes,_std::default_delete<FluxBoxes>,_true,_true> _Var4;
  _Head_base<0UL,_FluxBoxes_*,_false> this_02;
  MultiFab *this_03;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  uint nghost;
  DistributionMapping *dm;
  MFInfo local_70;
  BoxArray *local_48;
  PeleLM *local_40;
  FabFactory<amrex::FArrayBox> local_38;
  
  bVar3 = std::operator==(&NavierStokesBase::redistribution_type_abi_cxx11_,"StateRedist");
  if (bVar3) {
    nghost = 3;
  }
  else {
    bVar3 = std::operator==(&NavierStokesBase::redistribution_type_abi_cxx11_,"NewStateRedist");
    nghost = bVar3 | 2;
  }
  this_01 = amrex::DescriptorList::operator[]((DescriptorList *)amrex::AmrLevel::desc_lst,0);
  nvar = amrex::StateDescriptor::nComp(this_01);
  std::vector<double,_std::allocator<double>_>::resize
            (&mTmpData.super_vector<double,_std::allocator<double>_>,(long)mHtoTiterMAX);
  _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
  super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
  super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl =
       (__uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>)operator_new(8);
  FluxBoxes::FluxBoxes
            ((FluxBoxes *)
             _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
             super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
             super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl,(AmrLevel *)this,nvar,nghost);
  this_00 = &this->raii_fbs;
  local_70._0_8_ =
       _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
       super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
       super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>,std::allocator<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>>
  ::emplace_back<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>
            ((vector<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>,std::allocator<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>>
              *)this_00,(unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)&local_70);
  std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::~unique_ptr
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)&local_70);
  this->EdgeState =
       ((this->raii_fbs).
        super_vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
        .
        super__Vector_base<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
        super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
        super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
        super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl)->data;
  _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
  super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
  super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl =
       (__uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>)operator_new(8);
  FluxBoxes::FluxBoxes
            ((FluxBoxes *)
             _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
             super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
             super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl,(AmrLevel *)this,nvar,nghost);
  local_70._0_8_ =
       _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
       super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
       super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>,std::allocator<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>>
  ::emplace_back<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>
            ((vector<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>,std::allocator<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>>
              *)this_00,(unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)&local_70);
  std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::~unique_ptr
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)&local_70);
  this->EdgeFlux =
       ((this->raii_fbs).
        super_vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
        .
        super__Vector_base<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
        super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
        super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
        super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl)->data;
  _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
  super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
  super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl =
       (__uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>)operator_new(8);
  FluxBoxes::FluxBoxes
            ((FluxBoxes *)
             _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
             super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
             super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl,(AmrLevel *)this,0x18,0);
  local_70._0_8_ =
       _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
       super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
       super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>,std::allocator<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>>
  ::emplace_back<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>
            ((vector<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>,std::allocator<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>>
              *)this_00,(unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)&local_70);
  std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::~unique_ptr
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)&local_70);
  this->SpecDiffusionFluxn =
       ((this->raii_fbs).
        super_vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
        .
        super__Vector_base<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
        super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
        super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
        super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl)->data;
  _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
  super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
  super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl =
       (__uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>)operator_new(8);
  FluxBoxes::FluxBoxes
            ((FluxBoxes *)
             _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
             super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
             super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl,(AmrLevel *)this,0x18,0);
  local_70._0_8_ =
       _Var4.super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
       super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
       super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>,std::allocator<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>>
  ::emplace_back<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>
            ((vector<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>,std::allocator<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>>
              *)this_00,(unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)&local_70);
  std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::~unique_ptr
            ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)&local_70);
  this->SpecDiffusionFluxnp1 =
       ((this->raii_fbs).
        super_vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
        .
        super__Vector_base<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
        super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
        super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
        super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl)->data;
  if (use_wbar != 0) {
    this_02._M_head_impl = (FluxBoxes *)operator_new(8);
    FluxBoxes::FluxBoxes(this_02._M_head_impl,(AmrLevel *)this,0x15,0);
    local_70._0_8_ = this_02._M_head_impl;
    std::
    vector<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>,std::allocator<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>>
    ::emplace_back<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>
              ((vector<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>,std::allocator<std::unique_ptr<FluxBoxes,std::default_delete<FluxBoxes>>>>
                *)this_00,(unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)&local_70);
    std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>::~unique_ptr
              ((unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_> *)&local_70);
    this->SpecDiffusionFluxWbar =
         ((this->raii_fbs).
          super_vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
          .
          super__Vector_base<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
          super___uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>._M_t.
          super__Tuple_impl<0UL,_FluxBoxes_*,_std::default_delete<FluxBoxes>_>.
          super__Head_base<0UL,_FluxBoxes_*,_false>._M_head_impl)->data;
  }
  local_48 = &(this->super_NavierStokesBase).super_AmrLevel.grids;
  dm = &(this->super_NavierStokesBase).super_AmrLevel.dmap;
  local_40 = this;
  for (p_Var6 = auxDiag_names_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pPVar2 = local_40,
      (_Rb_tree_header *)p_Var6 != &auxDiag_names_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    this_03 = (MultiFab *)operator_new(0x180);
    local_70._0_8_ = (__uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>)0x1;
    local_70.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70.arena = (Arena *)0x0;
    local_70.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._vptr_FabFactory = (_func_int **)&PTR__FabFactory_007d2928;
    amrex::MultiFab::MultiFab
              (this_03,local_48,dm,
               (int)((ulong)((long)p_Var6[2]._M_parent - *(long *)(p_Var6 + 2)) >> 5),0,&local_70,
               &local_38);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
             ::operator[](&this->auxDiag,(key_type *)(p_Var6 + 1));
    pMVar1 = (pmVar5->_M_t).
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    (pmVar5->_M_t).super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
    _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = this_03;
    if (pMVar1 != (MultiFab *)0x0) {
      (**(code **)(*(long *)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_70.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
             ::operator[](&this->auxDiag,(key_type *)(p_Var6 + 1));
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&((pmVar5->_M_t).
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                super_FabArray<amrex::FArrayBox>,0.0);
  }
  pMVar1 = &local_40->external_sources;
  local_70._0_8_ = (__uniq_ptr_impl<FluxBoxes,_std::default_delete<FluxBoxes>_>)0x1;
  local_70.arena = (Arena *)0x0;
  local_70.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::define
            (pMVar1,local_48,dm,NavierStokesBase::NUM_STATE,nGrowAdvForcing,&local_70,
             (local_40->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&pMVar1->super_FabArray<amrex::FArrayBox>,0.0);
  if ((pPVar2->super_NavierStokesBase).super_AmrLevel.level == 0) {
    stripBox.smallend.vect._4_8_ =
         *(undefined8 *)
          ((pPVar2->super_NavierStokesBase).super_AmrLevel.geom.domain.smallend.vect + 1);
    stripBox.bigend.vect._4_8_ =
         *(undefined8 *)
          ((pPVar2->super_NavierStokesBase).super_AmrLevel.geom.domain.bigend.vect + 1);
    stripBox.smallend.vect[0] = 0;
    stripBox.bigend.vect[0] = 0;
    stripBox.btype.itype = 0;
  }
  return;
}

Assistant:

void
PeleLM::define_data ()
{
   const int nGrow       = 0;
#ifdef AMREX_USE_EB
   // Only the advection piece uses this, so set based on hydro. redistribution_type
   const int nGrowEdges  = (redistribution_type == "StateRedist"||
                            redistribution_type == "NewStateRedist") ? 3 : 2;
#else
   const int nGrowEdges  = 0;
#endif
   const int nEdgeStates = desc_lst[State_Type].nComp();

   mTmpData.resize(mHtoTiterMAX);

   raii_fbs.push_back(std::unique_ptr<FluxBoxes>{new FluxBoxes(this, nEdgeStates, nGrowEdges)});
   EdgeState = raii_fbs.back()->get();

   raii_fbs.push_back(std::unique_ptr<FluxBoxes>{new FluxBoxes(this, nEdgeStates, nGrowEdges)});
   EdgeFlux  = raii_fbs.back()->get();

   if (NUM_SPECIES>0)
   {
     raii_fbs.push_back(std::unique_ptr<FluxBoxes>{new FluxBoxes(this, NUM_SPECIES+3, nGrow)});
     SpecDiffusionFluxn   = raii_fbs.back()->get();

     raii_fbs.push_back(std::unique_ptr<FluxBoxes>{new FluxBoxes(this, NUM_SPECIES+3, nGrow)});
     SpecDiffusionFluxnp1 = raii_fbs.back()->get();

#ifndef NDEBUG
     for ( int i = 0; i<AMREX_SPACEDIM; i++) {
       SpecDiffusionFluxnp1[i]->setVal(1.2345e40);
       SpecDiffusionFluxn[i]->setVal(1.2345e40);
     }
#endif

     if (use_wbar) {
        raii_fbs.push_back(std::unique_ptr<FluxBoxes>{new FluxBoxes(this, NUM_SPECIES, nGrow)});
        SpecDiffusionFluxWbar = raii_fbs.back()->get();
     }
   }

   for (const auto& kv : auxDiag_names)
   {
      auxDiag[kv.first] = std::unique_ptr<MultiFab>(new MultiFab(grids,dmap,kv.second.size(),0));
      auxDiag[kv.first]->setVal(0.0);
   }
   const int nGrowS = nGrowAdvForcing; // TODO: Ensure this is enough
   external_sources.define(grids, dmap, NUM_STATE, nGrowS, amrex::MFInfo(), Factory());
   external_sources.setVal(0.);
   // HACK for debugging
   if (level==0)
      stripBox = getStrip(geom);
}